

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O1

void __thiscall r_exec::HLPBindingMap::init_from_hlp(HLPBindingMap *this,Code *hlp)

{
  byte bVar1;
  char cVar2;
  uint8_t id;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ushort uVar6;
  Atom a;
  undefined4 local_2c;
  
  (*(hlp->super__Object)._vptr__Object[5])(hlp,1);
  uVar3 = r_code::Atom::asIndex();
  (*(hlp->super__Object)._vptr__Object[5])(hlp,(ulong)uVar3);
  bVar1 = r_code::Atom::getAtomCount();
  if (bVar1 != 0) {
    uVar6 = (ushort)bVar1;
    do {
      uVar3 = uVar3 + 1;
      iVar5 = (*(hlp->super__Object)._vptr__Object[5])(hlp,(ulong)uVar3);
      local_2c = *(undefined4 *)CONCAT44(extraout_var,iVar5);
      cVar2 = r_code::Atom::getDescriptor();
      if (cVar2 == -0x7a) {
        id = r_code::Atom::asIndex();
        BindingMap::add_unbound_value(&this->super_BindingMap,id);
      }
      r_code::Atom::~Atom((Atom *)&local_2c);
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  (this->super_BindingMap).first_index =
       (uint16_t)
       ((uint)(*(int *)&(this->super_BindingMap).map.
                        super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
              *(int *)&(this->super_BindingMap).map.
                       super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
  (*(hlp->super__Object)._vptr__Object[5])(hlp,2);
  uVar3 = r_code::Atom::asIndex();
  (*(hlp->super__Object)._vptr__Object[5])(hlp,(ulong)uVar3);
  bVar1 = r_code::Atom::getAtomCount();
  if (bVar1 != 0) {
    uVar6 = 0;
    do {
      (*(hlp->super__Object)._vptr__Object[5])(hlp,(ulong)(ushort)(uVar3 + 1 + uVar6));
      uVar4 = r_code::Atom::asIndex();
      iVar5 = (*(hlp->super__Object)._vptr__Object[9])(hlp,(ulong)uVar4);
      init_from_pattern(this,(Code *)CONCAT44(extraout_var_00,iVar5),uVar6);
      uVar6 = uVar6 + 1;
    } while (bVar1 != uVar6);
  }
  return;
}

Assistant:

void HLPBindingMap::init_from_hlp(const Code *hlp)   // hlp is cst or mdl.
{
    uint16_t tpl_arg_set_index = hlp->code(HLP_TPL_ARGS).asIndex();
    uint16_t tpl_arg_count = hlp->code(tpl_arg_set_index).getAtomCount();

    for (uint16_t i = 1; i <= tpl_arg_count; ++i) {
        Atom a = hlp->code(tpl_arg_set_index + i);

        if (a.getDescriptor() == Atom::VL_PTR) {
            add_unbound_value(a.asIndex());
        }
    }

    first_index = map.size();
    uint16_t obj_set_index = hlp->code(HLP_OBJS).asIndex();
    uint16_t obj_count = hlp->code(obj_set_index).getAtomCount();

    for (uint16_t i = 1; i <= obj_count; ++i) {
        _Fact *pattern = (_Fact *)hlp->get_reference(hlp->code(obj_set_index + i).asIndex());
        init_from_pattern(pattern, i - 1);
    }
}